

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatMem.c
# Opt level: O1

Msat_MmFixed_t * Msat_MmFixedStart(int nEntrySize)

{
  uint uVar1;
  Msat_MmFixed_t *pMVar2;
  char **ppcVar3;
  
  pMVar2 = (Msat_MmFixed_t *)malloc(0x38);
  pMVar2->nEntrySize = 0;
  pMVar2->nEntriesAlloc = 0;
  pMVar2->nEntriesUsed = 0;
  pMVar2->nEntriesMax = 0;
  pMVar2->pEntriesFree = (char *)0x0;
  pMVar2->nChunkSize = 0;
  pMVar2->nChunksAlloc = 0;
  *(undefined8 *)&pMVar2->nChunks = 0;
  pMVar2->pChunks = (char **)0x0;
  pMVar2->nMemoryUsed = 0;
  pMVar2->nMemoryAlloc = 0;
  pMVar2->nEntrySize = nEntrySize;
  pMVar2->nEntriesAlloc = 0;
  pMVar2->nEntriesUsed = 0;
  pMVar2->pEntriesFree = (char *)0x0;
  uVar1 = 0x400;
  if (0x3f < nEntrySize) {
    uVar1 = 0x10000 / (uint)nEntrySize;
  }
  pMVar2->nChunkSize = uVar1;
  if (uVar1 < 8) {
    pMVar2->nChunkSize = 8;
  }
  pMVar2->nChunksAlloc = 0x40;
  pMVar2->nChunks = 0;
  ppcVar3 = (char **)malloc(0x200);
  pMVar2->pChunks = ppcVar3;
  pMVar2->nMemoryUsed = 0;
  pMVar2->nMemoryAlloc = 0;
  return pMVar2;
}

Assistant:

Msat_MmFixed_t * Msat_MmFixedStart( int nEntrySize )
{
    Msat_MmFixed_t * p;

    p = ABC_ALLOC( Msat_MmFixed_t, 1 );
    memset( p, 0, sizeof(Msat_MmFixed_t) );

    p->nEntrySize    = nEntrySize;
    p->nEntriesAlloc = 0;
    p->nEntriesUsed  = 0;
    p->pEntriesFree  = NULL;

    if ( nEntrySize * (1 << 10) < (1<<16) )
        p->nChunkSize = (1 << 10);
    else
        p->nChunkSize = (1<<16) / nEntrySize;
    if ( p->nChunkSize < 8 )
        p->nChunkSize = 8;

    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );

    p->nMemoryUsed   = 0;
    p->nMemoryAlloc  = 0;
    return p;
}